

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

Image * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,polymorphic_allocator<std::byte> *args)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  memory_resource *pmVar4;
  undefined1 auVar5 [16];
  Image *pIVar3;
  
  iVar2 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x98,8);
  pIVar3 = (Image *)CONCAT44(extraout_var,iVar2);
  pmVar1 = args->memoryResource;
  pIVar3->format = U256;
  (pIVar3->resolution).super_Tuple2<pbrt::Point2,_int>.x = 0;
  (pIVar3->resolution).super_Tuple2<pbrt::Point2,_int>.y = 0;
  pmVar4 = new_delete_resource();
  (pIVar3->channelNames).alloc.memoryResource = pmVar4;
  (pIVar3->channelNames).ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (pIVar3->channelNames).nAlloc = 0;
  (pIVar3->channelNames).nStored = 0;
  (pIVar3->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (pIVar3->p8).alloc.memoryResource = pmVar1;
  auVar5 = ZEXT416(0) << 0x40;
  (pIVar3->p8).ptr = (uchar *)auVar5._0_8_;
  (pIVar3->p8).nAlloc = auVar5._8_8_;
  (pIVar3->p8).nStored = 0;
  (pIVar3->p16).alloc.memoryResource = pmVar1;
  (pIVar3->p16).ptr = (Half *)auVar5._0_8_;
  (pIVar3->p16).nAlloc = auVar5._8_8_;
  (pIVar3->p16).nStored = 0;
  (pIVar3->p32).alloc.memoryResource = pmVar1;
  (pIVar3->p32).ptr = (float *)auVar5._0_8_;
  (pIVar3->p32).nAlloc = auVar5._8_8_;
  (pIVar3->p32).nStored = 0;
  return pIVar3;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }